

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeQuadSensSStolerances(void *cvode_mem,sunrealtype reltolQS,sunrealtype *abstolQS)

{
  long lVar1;
  void *pvVar2;
  int line;
  long lVar3;
  int error_code;
  char *msgfmt;
  int iVar4;
  long lVar5;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar4 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x97c;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar4 = -0x28;
    error_code = -0x28;
    line = 0x985;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x86c) == 0) {
      cvProcessError((CVodeMem)cvode_mem,-0x32,0x98e,"CVodeQuadSensSStolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Forward sensitivity analysis for quadrature variables not activated.");
      return -0x1e;
    }
    if (0.0 <= reltolQS) {
      if (abstolQS != (sunrealtype *)0x0) {
        lVar5 = (long)*(int *)((long)cvode_mem + 0x90);
        if (0 < lVar5) {
          lVar1 = 0;
          do {
            if (abstolQS[lVar1] <= 0.0 && abstolQS[lVar1] != 0.0) {
              msgfmt = "abstolQS has negative component(s) (illegal).";
              iVar4 = -0x16;
              error_code = -0x16;
              line = 0x9a7;
              goto LAB_00116a28;
            }
            lVar1 = lVar1 + 1;
          } while (lVar5 != lVar1);
        }
        *(undefined4 *)((long)cvode_mem + 0x128) = 1;
        *(sunrealtype *)((long)cvode_mem + 0x130) = reltolQS;
        if (*(int *)((long)cvode_mem + 0x868) == 0) {
          *(undefined8 *)((long)cvode_mem + 0x138) = 0;
          pvVar2 = malloc(lVar5 * 8);
          *(void **)((long)cvode_mem + 0x138) = pvVar2;
          pvVar2 = malloc(lVar5 * 4);
          *(void **)((long)cvode_mem + 0x148) = pvVar2;
          *(long *)((long)cvode_mem + 0x718) = *(long *)((long)cvode_mem + 0x718) + lVar5;
          *(undefined4 *)((long)cvode_mem + 0x868) = 1;
        }
        if (0 < *(int *)((long)cvode_mem + 0x90)) {
          lVar5 = *(long *)((long)cvode_mem + 0x138);
          lVar1 = *(long *)((long)cvode_mem + 0x148);
          lVar3 = 0;
          do {
            *(sunrealtype *)(lVar5 + lVar3 * 8) = abstolQS[lVar3];
            *(uint *)(lVar1 + lVar3 * 4) = -(uint)(abstolQS[lVar3] == 0.0) & 1;
            lVar3 = lVar3 + 1;
          } while (lVar3 < *(int *)((long)cvode_mem + 0x90));
          return 0;
        }
        return 0;
      }
      msgfmt = "abstolQS = NULL illegal.";
      iVar4 = -0x16;
      error_code = -0x16;
      line = 0x99e;
    }
    else {
      msgfmt = "reltolQS < 0 illegal.";
      iVar4 = -0x16;
      error_code = -0x16;
      line = 0x997;
    }
  }
LAB_00116a28:
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeQuadSensSStolerances",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar4;
}

Assistant:

int CVodeQuadSensSStolerances(void* cvode_mem, sunrealtype reltolQS,
                              sunrealtype* abstolQS)
{
  CVodeMem cv_mem;
  int is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOLQS);
    return (CV_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_ABSTOLQS);
    return (CV_ILL_INPUT);
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    if (abstolQS[is] < ZERO)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_ABSTOLQS);
      return (CV_ILL_INPUT);
    }
  }

  /* Copy tolerances into memory */

  cv_mem->cv_itolQS = CV_SS;

  cv_mem->cv_reltolQS = reltolQS;

  if (!(cv_mem->cv_SabstolQSMallocDone))
  {
    cv_mem->cv_SabstolQS = NULL;
    cv_mem->cv_SabstolQS =
      (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
    cv_mem->cv_atolQSmin0 =
      (sunbooleantype*)malloc(cv_mem->cv_Ns * sizeof(sunbooleantype));
    cv_mem->cv_lrw += cv_mem->cv_Ns;
    cv_mem->cv_SabstolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    cv_mem->cv_SabstolQS[is]  = abstolQS[is];
    cv_mem->cv_atolQSmin0[is] = (abstolQS[is] == ZERO);
  }

  return (CV_SUCCESS);
}